

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlGetStringFromDictionaryByKey
                    (JlDataObject *DictionaryObject,char *KeyName,char **pString)

{
  JL_STATUS JVar1;
  JlDataObject *object;
  
  if (pString != (char **)0x0 && (KeyName != (char *)0x0 && DictionaryObject != (JlDataObject *)0x0)
     ) {
    *pString = (char *)0x0;
    object = (JlDataObject *)0x0;
    JVar1 = JlGetObjectFromDictionaryByKey(DictionaryObject,KeyName,&object);
    if (JVar1 == JL_STATUS_SUCCESS) {
      if (object == (JlDataObject *)0x0) {
        JVar1 = JL_STATUS_INVALID_PARAMETER;
      }
      else if (object->Type == JL_DATA_TYPE_STRING) {
        *pString = (object->field_2).String;
        JVar1 = JL_STATUS_SUCCESS;
      }
      else {
        JVar1 = JL_STATUS_WRONG_TYPE;
      }
    }
    return JVar1;
  }
  return JL_STATUS_INVALID_PARAMETER;
}

Assistant:

JL_STATUS
    JlGetStringFromDictionaryByKey
    (
        JlDataObject const*         DictionaryObject,
        char const*                 KeyName,
        char const**                pString
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != KeyName
        &&  NULL != pString )
    {
        *pString = NULL;

        JlDataObject* object = NULL;
        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, KeyName, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            char const* stringPtr = NULL;
            jlStatus = JlGetObjectString( object, &stringPtr );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                *pString = stringPtr;
            }
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}